

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__create_3d__format__hint
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *text_00;
  long lVar1;
  bool bVar2;
  StringHash SVar3;
  long lVar4;
  xmlChar **ppxVar5;
  bool local_43;
  bool local_42;
  bool local_41;
  create_3d__format__hint__AttributeData *local_40;
  ParserTemplateBase *local_38;
  
  local_38 = (ParserTemplateBase *)this;
  local_40 = GeneratedSaxParser::ParserTemplateBase::
             newData<COLLADASaxFWL15::create_3d__format__hint__AttributeData>
                       ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar5 = attributes->attributes;
  if (ppxVar5 == (xmlChar **)0x0) {
LAB_0076594d:
    if ((local_40->channels == ENUM__image_format_hint_channels_enum__NOT_PRESENT) &&
       (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,
                           0x6f054,0xe854ea3,(ParserChar *)0x0), bVar2)) {
      return false;
    }
    if ((local_40->range == ENUM__image_format_hint_range_enum__NOT_PRESENT) &&
       (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,
                           0x6f054,0x7884d5,(ParserChar *)0x0), bVar2)) {
      return false;
    }
    return true;
  }
LAB_007657b9:
  while (text = *ppxVar5, text != (ParserChar *)0x0) {
    SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
    text_00 = ppxVar5[1];
    ppxVar5 = ppxVar5 + 2;
    if (SVar3 == 0x7884d5) {
      SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text_00,&local_42);
      lVar1 = 0;
      while (lVar4 = lVar1, lVar4 + 0x10 != 0x60) {
        lVar1 = lVar4 + 0x10;
        if (*(StringHash *)((long)&ENUM__image_format_hint_range_enumMap + lVar4) == SVar3)
        goto code_r0x0076589c;
      }
      local_42 = true;
      local_40->range = ENUM__image_format_hint_range_enum__COUNT;
      SVar3 = 0x7884d5;
LAB_0076592e:
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,0x6f054,
                         SVar3,text_00);
      if (bVar2) {
        return false;
      }
    }
    else if (SVar3 == 0x7a6795) {
      local_40->space = text_00;
    }
    else if (SVar3 == 0xba0e9de) {
      SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text_00,&local_43);
      lVar1 = 0;
      do {
        lVar4 = lVar1;
        if (lVar4 + 0x10 == 0x60) {
          local_43 = true;
          local_40->precision = ENUM__image_format_hint_precision_enum__COUNT;
          SVar3 = 0xba0e9de;
          goto LAB_0076592e;
        }
        lVar1 = lVar4 + 0x10;
      } while (*(StringHash *)((long)&ENUM__image_format_hint_precision_enumMap + lVar4) != SVar3);
      local_40->precision = *(ENUM__image_format_hint_precision_enum *)((long)&DAT_00869378 + lVar4)
      ;
    }
    else if (SVar3 == 0xe854ea3) {
      SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text_00,&local_41);
      lVar1 = 0;
      do {
        lVar4 = lVar1;
        if (lVar4 + 0x10 == 0x70) {
          local_41 = true;
          local_40->channels = ENUM__image_format_hint_channels_enum__COUNT;
          SVar3 = 0xe854ea3;
          goto LAB_0076592e;
        }
        lVar1 = lVar4 + 0x10;
      } while (*(StringHash *)((long)&ENUM__image_format_hint_channels_enumMap + lVar4) != SVar3);
      local_40->channels = *(ENUM__image_format_hint_channels_enum *)((long)&DAT_008692c8 + lVar4);
    }
    else {
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0x6f054,text,
                         text_00);
      if (bVar2) {
        return false;
      }
    }
  }
  goto LAB_0076594d;
code_r0x0076589c:
  local_40->range = *(ENUM__image_format_hint_range_enum *)((long)&DAT_00869328 + lVar4);
  goto LAB_007657b9;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__create_3d__format__hint( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__create_3d__format__hint( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

create_3d__format__hint__AttributeData* attributeData = newData<create_3d__format__hint__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_CHANNELS:
    {
bool failed;
attributeData->channels = Utils::toEnum<ENUM__image_format_hint_channels_enum, StringHash, ENUM__image_format_hint_channels_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_channels_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_CHANNELS,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_RANGE:
    {
bool failed;
attributeData->range = Utils::toEnum<ENUM__image_format_hint_range_enum, StringHash, ENUM__image_format_hint_range_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_range_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_RANGE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PRECISION:
    {
bool failed;
attributeData->precision = Utils::toEnum<ENUM__image_format_hint_precision_enum, StringHash, ENUM__image_format_hint_precision_enum__COUNT>(attributeValue, failed, ENUM__image_format_hint_precision_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_HINT,
        HASH_ATTRIBUTE_PRECISION,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_SPACE:
    {

attributeData->space = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_HINT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( attributeData->channels == ENUM__image_format_hint_channels_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_HINT, HASH_ATTRIBUTE_CHANNELS, 0 ) )
        return false;
}
if ( attributeData->range == ENUM__image_format_hint_range_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_HINT, HASH_ATTRIBUTE_RANGE, 0 ) )
        return false;
}


    return true;
}